

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O2

ConstructBlockSet * __thiscall
spvtools::val::Construct::blocks
          (ConstructBlockSet *__return_storage_ptr__,Construct *this,Function *param_1)

{
  ConstructType CVar1;
  BasicBlock *this_00;
  pointer ppBVar2;
  bool bVar3;
  pointer ppBVar4;
  pair<std::_Rb_tree_iterator<spvtools::val::BasicBlock_*>,_bool> pVar5;
  BasicBlock *block;
  ConstructBlockSet *construct_blocks;
  BasicBlock *succ;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  BasicBlock *local_70;
  _Rb_tree<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*,std::_Identity<spvtools::val::BasicBlock*>,spvtools::val::less_than_id,std::allocator<spvtools::val::BasicBlock*>>
  *local_68;
  BasicBlock *local_60;
  BasicBlock *local_58;
  BasicBlock *local_50;
  _Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> local_48;
  
  this_00 = this->entry_block_;
  CVar1 = this->type_;
  if (CVar1 == kLoop) {
    local_60 = (*(this->corresponding_constructs_).
                 super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->entry_block_;
  }
  else {
    local_60 = (BasicBlock *)0x0;
  }
  local_58 = this->exit_block_;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = this_00;
  local_68 = (_Rb_tree<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*,std::_Identity<spvtools::val::BasicBlock*>,spvtools::val::less_than_id,std::allocator<spvtools::val::BasicBlock*>>
              *)__return_storage_ptr__;
  std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
  emplace_back<spvtools::val::BasicBlock*>
            ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
             &local_48,&local_70);
  *(_Rb_tree_color *)(local_68 + 8) = _S_red;
  *(_Base_ptr *)(local_68 + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)(local_68 + 0x18) = (_Base_ptr)(local_68 + 8);
  *(_Base_ptr *)(local_68 + 0x20) = (_Base_ptr)(local_68 + 8);
  *(size_t *)(local_68 + 0x28) = 0;
LAB_0018aa04:
  do {
    if (local_48._M_impl.super__Vector_impl_data._M_start ==
        local_48._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      ~_Vector_base(&local_48);
      return (ConstructBlockSet *)local_68;
    }
    local_70 = local_48._M_impl.super__Vector_impl_data._M_finish[-1];
    local_48._M_impl.super__Vector_impl_data._M_finish =
         local_48._M_impl.super__Vector_impl_data._M_finish + -1;
    bVar3 = BasicBlock::structurally_dominates(this_00,local_70);
  } while (!bVar3);
  if (CVar1 != kContinue) goto LAB_0018aa4a;
  bVar3 = BasicBlock::structurally_postdominates(local_58,local_70);
  if (!bVar3) goto LAB_0018aa4a;
  goto LAB_0018aa76;
LAB_0018aa4a:
  bVar3 = BasicBlock::structurally_dominates(local_58,local_70);
  if (CVar1 == kLoop && !bVar3) {
    bVar3 = BasicBlock::structurally_dominates(local_60,local_70);
  }
  if (bVar3 == false) {
LAB_0018aa76:
    pVar5 = std::
            _Rb_tree<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*,std::_Identity<spvtools::val::BasicBlock*>,spvtools::val::less_than_id,std::allocator<spvtools::val::BasicBlock*>>
            ::_M_insert_unique<spvtools::val::BasicBlock*const&>(local_68,&local_70);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ppBVar2 = (local_70->structural_successors_).
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar4 = (local_70->structural_successors_).
                     super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar2;
          ppBVar4 = ppBVar4 + 1) {
        local_50 = *ppBVar4;
        std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
        push_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   *)&local_48,&local_50);
      }
    }
  }
  goto LAB_0018aa04;
}

Assistant:

Construct::ConstructBlockSet Construct::blocks(Function* /*function*/) const {
  const auto header = entry_block();
  const auto exit = exit_block();
  const bool is_continue = type() == ConstructType::kContinue;
  const bool is_loop = type() == ConstructType::kLoop;
  const BasicBlock* continue_header = nullptr;
  if (is_loop) {
    // The only corresponding construct for a loop is the continue.
    continue_header = (*corresponding_constructs().begin())->entry_block();
  }
  std::vector<BasicBlock*> stack;
  stack.push_back(const_cast<BasicBlock*>(header));
  ConstructBlockSet construct_blocks;
  while (!stack.empty()) {
    auto* block = stack.back();
    stack.pop_back();

    if (header->structurally_dominates(*block)) {
      bool include = false;
      if (is_continue && exit->structurally_postdominates(*block)) {
        // Continue construct include blocks dominated by the continue target
        // and post-dominated by the back-edge block.
        include = true;
      } else if (!exit->structurally_dominates(*block)) {
        // Selection and loop constructs include blocks dominated by the header
        // and not dominated by the merge.
        include = true;
        if (is_loop && continue_header->structurally_dominates(*block)) {
          // Loop constructs have an additional constraint that they do not
          // include blocks dominated by the continue construct. Since all
          // blocks in the continue construct are dominated by the continue
          // target, we just test for dominance by continue target.
          include = false;
        }
      }
      if (include) {
        if (!construct_blocks.insert(block).second) continue;

        for (auto succ : *block->structural_successors()) {
          stack.push_back(succ);
        }
      }
    }
  }

  return construct_blocks;
}